

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

bool __thiscall
libcellml::Validator::ValidatorImpl::hasAtLeastOneMathmlChild
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  sVar1 = mathmlChildCount(node);
  if (sVar1 == 0) {
    XmlNode::name_abi_cxx11_
              (&local_40,
               (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::operator+(&local_80,"Math has a \'",&local_40);
    std::operator+(&local_60,&local_80,"\' element without at least one MathML child.");
    addMathmlIssue(this,&local_60,MATH_MATHML,component);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return sVar1 != 0;
}

Assistant:

bool Validator::ValidatorImpl::hasAtLeastOneMathmlChild(const XmlNodePtr &node,
                                                        const ComponentPtr &component)
{
    if (mathmlChildCount(node) < 1) {
        addMathmlIssue("Math has a '" + node->name() + "' element without at least one MathML child.",
                       Issue::ReferenceRule::MATH_MATHML,
                       component);

        return false;
    }

    return true;
}